

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  string_view format;
  Arg local_b0;
  Arg local_80;
  ulong local_50;
  long local_48;
  
  local_48 = *(long *)(*(long *)(*(long *)this + 0x20) + 0x10);
  local_50 = (ulong)*(ushort *)(local_48 + 2);
  local_48 = ~local_50 + local_48;
  substitute_internal::Arg::Arg(&local_80,*(int *)(*(long *)this + 4));
  local_b0.piece_._M_len = **(size_t **)(this + 8);
  local_b0.piece_._M_str = (char *)(*(size_t **)(this + 8))[1];
  format._M_str = (char *)&local_50;
  format._M_len =
       (size_t)"\"$0\" extension field $1 is expected to have field name \"$2\", not \"$3\".";
  Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)0x46,format,&local_80,&local_b0,
             (Arg *)&stack0xffffffffffffff20,*(Arg **)(*(long *)(this + 0x10) + 8));
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}